

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_support_format_zip_streamable(archive *_a)

{
  int iVar1;
  void *__s;
  _func_int64_t_archive_read_ptr_int64_t_int *unaff_RBX;
  archive *in_RDI;
  _func_int_archive_read_ptr *unaff_R14;
  _func_int_archive_read_ptr *unaff_retaddr;
  _func_int_archive_read_ptr *in_stack_00000008;
  wchar_t magic_test;
  wchar_t r;
  zip *zip;
  archive_read *a;
  undefined4 in_stack_ffffffffffffffcc;
  archive *read_data;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  wchar_t wVar2;
  
  read_data = in_RDI;
  iVar1 = __archive_check_magic(_a,a._4_4_,(uint)a,zip->format_name);
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else {
    __s = malloc(0x170);
    if (__s == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate zip data");
      wVar2 = L'\xffffffe2';
    }
    else {
      memset(__s,0,0x170);
      *(undefined4 *)((long)__s + 0x16c) = 0;
      *(undefined4 *)((long)__s + 0x58) = 0xffffffff;
      *(code **)((long)__s + 0xb8) = real_crc32;
      iVar1 = __archive_read_register_format
                        ((archive_read *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                         archive_read_format_zip_has_encrypted_entries,
                         (char *)archive_read_support_format_zip_capabilities_streamable,
                         archive_read_format_zip_cleanup,
                         (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         archive_read_format_zip_read_data_skip_streamable,
                         (_func_int_archive_read_ptr_void_ptr_ptr_size_t_ptr_int64_t_ptr *)read_data
                         ,(_func_int_archive_read_ptr *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),unaff_RBX,
                         unaff_R14,unaff_retaddr,in_stack_00000008);
      if (iVar1 != 0) {
        free(__s);
      }
      wVar2 = L'\0';
    }
  }
  return wVar2;
}

Assistant:

int
archive_read_support_format_zip_streamable(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct zip *zip;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_zip");

	zip = (struct zip *)malloc(sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip data");
		return (ARCHIVE_FATAL);
	}
	memset(zip, 0, sizeof(*zip));

	/* Streamable reader doesn't support mac extensions. */
	zip->process_mac_extensions = 0;

	/*
	 * Until enough data has been read, we cannot tell about
	 * any encrypted entries yet.
	 */
	zip->has_encrypted_entries = ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;
	zip->crc32func = real_crc32;

	r = __archive_read_register_format(a,
	    zip,
	    "zip",
	    archive_read_format_zip_streamable_bid,
	    archive_read_format_zip_options,
	    archive_read_format_zip_streamable_read_header,
	    archive_read_format_zip_read_data,
	    archive_read_format_zip_read_data_skip_streamable,
	    NULL,
	    archive_read_format_zip_cleanup,
	    archive_read_support_format_zip_capabilities_streamable,
	    archive_read_format_zip_has_encrypted_entries);

	if (r != ARCHIVE_OK)
		free(zip);
	return (ARCHIVE_OK);
}